

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_item.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::get_item::get_item
          (get_item *this,node *dht_node,node_id *target,data_callback *dcallback,
          nodes_callback *ncallback)

{
  _Manager_type p_Var1;
  undefined8 uVar2;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  local_20 = ncallback->_M_invoker;
  p_Var1 = (ncallback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(ncallback->super__Function_base)._M_functor;
    local_38._8_8_ = *(undefined8 *)((long)&(ncallback->super__Function_base)._M_functor + 8);
    (ncallback->super__Function_base)._M_manager = (_Manager_type)0x0;
    ncallback->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  find_data::find_data(&this->super_find_data,dht_node,target,(nodes_callback *)&local_38);
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  (this->super_find_data).super_traversal_algorithm._vptr_traversal_algorithm =
       (_func_int **)&PTR__get_item_004f94a0;
  *(undefined8 *)&(this->m_data_callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_data_callback).super__Function_base._M_functor + 8) = 0;
  (this->m_data_callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_data_callback)._M_invoker = dcallback->_M_invoker;
  if ((dcallback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)((long)&(dcallback->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->m_data_callback).super__Function_base._M_functor =
         *(undefined8 *)&(dcallback->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->m_data_callback).super__Function_base._M_functor + 8) = uVar2;
    (this->m_data_callback).super__Function_base._M_manager =
         (dcallback->super__Function_base)._M_manager;
    (dcallback->super__Function_base)._M_manager = (_Manager_type)0x0;
    dcallback->_M_invoker = (_Invoker_type)0x0;
  }
  entry::entry(&(this->m_data).m_value);
  (this->m_data).m_salt._M_dataplus._M_p = (pointer)&(this->m_data).m_salt.field_2;
  (this->m_data).m_salt._M_string_length = 0;
  (this->m_data).m_salt.field_2._M_local_buf[0] = '\0';
  (this->m_data).m_seq.value = 0;
  (this->m_data).m_mutable = false;
  this->m_immutable = true;
  return;
}

Assistant:

get_item::get_item(
	node& dht_node
	, node_id const& target
	, data_callback dcallback
	, nodes_callback ncallback)
	: find_data(dht_node, target, std::move(ncallback))
	, m_data_callback(std::move(dcallback))
	, m_immutable(true)
{
}